

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs,TrainCallback *callback)

{
  byte bVar1;
  element_type *peVar2;
  invalid_argument *this_00;
  string *psVar3;
  ulong uVar4;
  FastText *this_01;
  ulong uVar5;
  size_type sVar6;
  long in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  Dictionary *in_stack_00000020;
  shared_ptr<fasttext::Loss> loss;
  shared_ptr<fasttext::Loss> loss_1;
  int j;
  int i;
  shared_ptr<fasttext::DenseMatrix> ninput;
  vector<int,_std::allocator<int>_> idx;
  bool normalizeGradient;
  shared_ptr<fasttext::DenseMatrix> output;
  shared_ptr<fasttext::DenseMatrix> input;
  shared_ptr<fasttext::DenseMatrix> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  Matrix *in_stack_fffffffffffffe98;
  double dVar7;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  int iVar8;
  undefined4 in_stack_fffffffffffffeac;
  real rVar9;
  real *in_stack_fffffffffffffeb0;
  element_type *in_stack_fffffffffffffeb8;
  shared_ptr<fasttext::DenseMatrix> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff60;
  FastText *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff78;
  int iVar10;
  undefined8 in_stack_ffffffffffffff80;
  int32_t cutoff;
  FastText *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> local_68;
  undefined1 local_49;
  __shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> local_38 [2];
  long local_10;
  
  cutoff = (int32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_10 = in_RSI;
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ba2b4);
  if (peVar2->model != sup) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"For now we only support quantization of supervised models");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  psVar3 = (string *)(local_10 + 0x38);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ba339);
  std::__cxx11::string::operator=((string *)&peVar2->input,psVar3);
  bVar1 = *(byte *)(local_10 + 0x110);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ba369);
  peVar2->qout = (bool)(bVar1 & 1);
  psVar3 = (string *)(local_10 + 0x58);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ba394);
  std::__cxx11::string::operator=((string *)&peVar2->output,psVar3);
  std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ba3e4);
  local_49 = peVar2->model == sup;
  if (*(long *)(local_10 + 0x118) != 0) {
    uVar5 = *(ulong *)(local_10 + 0x118);
    std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ba42e);
    uVar4 = Matrix::size(in_stack_fffffffffffffe98,
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (uVar5 < uVar4) {
      selectEmbeddings(in_stack_ffffffffffffff88,cutoff);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1ba48a);
      Dictionary::prune(in_stack_00000020,in_stack_00000018);
      this_01 = (FastText *)std::vector<int,_std::allocator<int>_>::size(&local_68);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1ba4be);
      std::make_shared<fasttext::DenseMatrix,unsigned_long,int&>
                ((unsigned_long *)in_stack_fffffffffffffeb8,(int *)in_stack_fffffffffffffeb0);
      iVar10 = 0;
      while( true ) {
        uVar5 = (ulong)iVar10;
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_68);
        if (sVar6 <= uVar5) break;
        in_stack_fffffffffffffecc = 0;
        while( true ) {
          in_stack_ffffffffffffff78 = in_stack_fffffffffffffecc;
          peVar2 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ba538);
          if (peVar2->dim <= in_stack_fffffffffffffecc) break;
          in_stack_fffffffffffffeb8 =
               std::
               __shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ba558);
          std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)iVar10);
          in_stack_fffffffffffffec0 =
               (shared_ptr<fasttext::DenseMatrix> *)
               DenseMatrix::at((DenseMatrix *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (int64_t)in_stack_fffffffffffffe88,0x1ba587);
          rVar9 = *(real *)&(in_stack_fffffffffffffec0->
                            super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr;
          std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ba5aa);
          in_stack_fffffffffffffeb0 =
               DenseMatrix::at((DenseMatrix *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (int64_t)in_stack_fffffffffffffe88,0x1ba5c2);
          *in_stack_fffffffffffffeb0 = rVar9;
          in_stack_fffffffffffffecc = in_stack_ffffffffffffff78 + 1;
        }
        iVar10 = iVar10 + 1;
      }
      std::shared_ptr<fasttext::DenseMatrix>::operator=
                ((shared_ptr<fasttext::DenseMatrix> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      if ((*(byte *)(local_10 + 0x111) & 1) != 0) {
        in_stack_fffffffffffffe94 = *(int *)(local_10 + 0x8c);
        peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ba69a);
        peVar2->epoch = in_stack_fffffffffffffe94;
        dVar7 = *(double *)(local_10 + 0x78);
        peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ba6c4);
        peVar2->lr = dVar7;
        in_stack_fffffffffffffea4 = *(int *)(local_10 + 0xb4);
        peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ba6ee);
        peVar2->thread = in_stack_fffffffffffffea4;
        iVar8 = *(int *)(local_10 + 0xe0);
        peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ba717);
        peVar2->verbose = iVar8;
        createLoss(in_stack_ffffffffffffff68,
                   (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff60._M_pi);
        std::
        make_shared<fasttext::Model,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
                  ((shared_ptr<fasttext::DenseMatrix> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec0,(shared_ptr<fasttext::Loss> *)in_stack_fffffffffffffeb8
                   ,(bool *)in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffe88 = (shared_ptr<fasttext::DenseMatrix> *)&stack0xffffffffffffff58;
        std::shared_ptr<fasttext::Model>::operator=
                  ((shared_ptr<fasttext::Model> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe88);
        std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1ba794);
        startThreads(this_01,(TrainCallback *)CONCAT44(iVar10,in_stack_ffffffffffffff78));
        std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x1ba7b8);
      }
      std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
                ((shared_ptr<fasttext::DenseMatrix> *)0x1ba7ea);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
  }
  std::__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>::get(local_38);
  std::make_shared<fasttext::QuantMatrix,fasttext::DenseMatrix,unsigned_long_const&,bool_const&>
            ((DenseMatrix *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (unsigned_long *)in_stack_fffffffffffffec0,(bool *)in_stack_fffffffffffffeb8);
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (shared_ptr<fasttext::QuantMatrix> *)in_stack_fffffffffffffe88);
  std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr((shared_ptr<fasttext::QuantMatrix> *)0x1ba876)
  ;
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ba883);
  if ((peVar2->qout & 1U) != 0) {
    std::__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>::get(&local_48);
    std::make_shared<fasttext::QuantMatrix,fasttext::DenseMatrix,int,bool_const&>
              ((DenseMatrix *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (int *)in_stack_fffffffffffffec0,(bool *)in_stack_fffffffffffffeb8);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (shared_ptr<fasttext::QuantMatrix> *)in_stack_fffffffffffffe88);
    std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr
              ((shared_ptr<fasttext::QuantMatrix> *)0x1ba8f3);
  }
  *(undefined1 *)(in_RDI + 0x68) = 1;
  createLoss(in_stack_ffffffffffffff68,
             (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff60._M_pi);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffec0,
             (shared_ptr<fasttext::Loss> *)in_stack_fffffffffffffeb8,
             (bool *)in_stack_fffffffffffffeb0);
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe88);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1ba96d);
  std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x1ba97a);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x1ba987)
  ;
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x1ba994)
  ;
  return;
}

Assistant:

void FastText::quantize(const Args& qargs, const TrainCallback& callback) {
  if (args_->model != model_name::sup) {
    throw std::invalid_argument(
        "For now we only support quantization of supervised models");
  }
  args_->input = qargs.input;
  args_->qout = qargs.qout;
  args_->output = qargs.output;
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  std::shared_ptr<DenseMatrix> output =
      std::dynamic_pointer_cast<DenseMatrix>(output_);
  bool normalizeGradient = (args_->model == model_name::sup);

  if (qargs.cutoff > 0 && qargs.cutoff < input->size(0)) {
    auto idx = selectEmbeddings(qargs.cutoff);
    dict_->prune(idx);
    std::shared_ptr<DenseMatrix> ninput =
        std::make_shared<DenseMatrix>(idx.size(), args_->dim);
    for (auto i = 0; i < idx.size(); i++) {
      for (auto j = 0; j < args_->dim; j++) {
        ninput->at(i, j) = input->at(idx[i], j);
      }
    }
    input = ninput;
    if (qargs.retrain) {
      args_->epoch = qargs.epoch;
      args_->lr = qargs.lr;
      args_->thread = qargs.thread;
      args_->verbose = qargs.verbose;
      auto loss = createLoss(output_);
      model_ = std::make_shared<Model>(input, output, loss, normalizeGradient);
      startThreads(callback);
    }
  }
  input_ = std::make_shared<QuantMatrix>(
      std::move(*(input.get())), qargs.dsub, qargs.qnorm);

  if (args_->qout) {
    output_ = std::make_shared<QuantMatrix>(
        std::move(*(output.get())), 2, qargs.qnorm);
  }
  quant_ = true;
  auto loss = createLoss(output_);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
}